

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PublicationInfo.cpp
# Opt level: O0

void __thiscall
helics::PublicationInfo::removeSubscriber(PublicationInfo *this,GlobalHandle subscriberToRemove)

{
  iterator this_00;
  __normal_iterator<helics::SubscriberInformation_*,_std::vector<helics::SubscriberInformation,_std::allocator<helics::SubscriberInformation>_>_>
  in_RSI;
  __normal_iterator<const_helics::SubscriberInformation_*,_std::vector<helics::SubscriberInformation,_std::allocator<helics::SubscriberInformation>_>_>
  *in_RDI;
  vector<helics::SubscriberInformation,_std::allocator<helics::SubscriberInformation>_>
  *in_stack_ffffffffffffff98;
  GlobalHandle in_stack_ffffffffffffffb8;
  const_iterator in_stack_ffffffffffffffc0;
  
  std::vector<helics::SubscriberInformation,_std::allocator<helics::SubscriberInformation>_>::begin
            (in_stack_ffffffffffffff98);
  std::vector<helics::SubscriberInformation,_std::allocator<helics::SubscriberInformation>_>::end
            (in_stack_ffffffffffffff98);
  std::
  remove_if<__gnu_cxx::__normal_iterator<helics::SubscriberInformation*,std::vector<helics::SubscriberInformation,std::allocator<helics::SubscriberInformation>>>,helics::PublicationInfo::removeSubscriber(helics::GlobalHandle)::__0>
            (in_RSI,(__normal_iterator<helics::SubscriberInformation_*,_std::vector<helics::SubscriberInformation,_std::allocator<helics::SubscriberInformation>_>_>
                     )in_stack_ffffffffffffffc0._M_current,
             (anon_class_8_1_d7936e25_for__M_pred)in_stack_ffffffffffffffb8);
  __gnu_cxx::
  __normal_iterator<helics::SubscriberInformation_const*,std::vector<helics::SubscriberInformation,std::allocator<helics::SubscriberInformation>>>
  ::__normal_iterator<helics::SubscriberInformation*>
            (in_RDI,(__normal_iterator<helics::SubscriberInformation_*,_std::vector<helics::SubscriberInformation,_std::allocator<helics::SubscriberInformation>_>_>
                     *)in_stack_ffffffffffffff98);
  this_00 = std::
            vector<helics::SubscriberInformation,_std::allocator<helics::SubscriberInformation>_>::
            end(in_stack_ffffffffffffff98);
  __gnu_cxx::
  __normal_iterator<helics::SubscriberInformation_const*,std::vector<helics::SubscriberInformation,std::allocator<helics::SubscriberInformation>>>
  ::__normal_iterator<helics::SubscriberInformation*>
            (in_RDI,(__normal_iterator<helics::SubscriberInformation_*,_std::vector<helics::SubscriberInformation,_std::allocator<helics::SubscriberInformation>_>_>
                     *)in_stack_ffffffffffffff98);
  std::vector<helics::SubscriberInformation,_std::allocator<helics::SubscriberInformation>_>::erase
            ((vector<helics::SubscriberInformation,_std::allocator<helics::SubscriberInformation>_>
              *)this_00._M_current,(const_iterator)in_RSI._M_current,in_stack_ffffffffffffffc0);
  return;
}

Assistant:

void PublicationInfo::removeSubscriber(GlobalHandle subscriberToRemove)
{
    subscribers.erase(std::remove_if(subscribers.begin(),
                                     subscribers.end(),
                                     [subscriberToRemove](const auto& val) {
                                         return val.id == subscriberToRemove;
                                     }),
                      subscribers.end());
}